

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_1::ContextResetCase::iterate(ContextResetCase *this)

{
  ostringstream *this_00;
  ResourceType RVar1;
  ContextResetType CVar2;
  TestLog *pTVar3;
  GLenum GVar4;
  ContextReset *ptr;
  char *description;
  GLboolean isContextRobust;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> contextReset;
  Enum<int,_2UL> local_1c90;
  Params local_1c80;
  RenderingContext context;
  EGLint local_1bf8 [6];
  undefined8 local_1be0;
  undefined4 local_1bd8;
  undefined1 local_1bd0 [384];
  Functions gl;
  
  glw::Functions::Functions(&gl);
  local_1bf8[0] = 0x3098;
  local_1bf8[1] = 3;
  local_1bf8[2] = 0x30fb;
  local_1bf8[3] = 1;
  local_1bf8[4] = 0x30bf;
  local_1bf8[5] =
       (EGLint)((this->super_RobustnessTestCase).m_params.m_robustAccessType == ROBUSTACCESS_TRUE);
  local_1be0 = 0x31bf00003138;
  local_1bd8 = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,local_1bf8);
  local_1bd0._0_8_ = (TestLog *)0x0;
  RenderingContext::RenderingContext
            (&context,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1bf8,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,(EGLContext *)local_1bd0);
  RenderingContext::makeCurrent(&context,&(this->super_RobustnessTestCase).m_eglSurface);
  RenderingContext::initGLFunctions(&context,&gl);
  checkRequiredGLRobustnessExtension(local_1bf8,&gl);
  RobustnessTestCase::Params::Params(&local_1c80,&(this->super_RobustnessTestCase).m_params);
  pTVar3 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  if (local_1c80.m_contextResetType == CONTEXTRESETTYPE_FIXED_FUNC_OOB) {
    ptr = (ContextReset *)operator_new(0x40);
    ptr->m_gl = &gl;
    ptr->m_log = pTVar3;
    ptr->m_fixedFunctionType = local_1c80.m_fixedFunctionType;
    ptr->_vptr_ContextReset = (_func_int **)&PTR__FixedFunctionOOB_01e03390;
    ptr[1]._vptr_ContextReset = (_func_int **)0x0;
  }
  else if (local_1c80.m_contextResetType == CONTEXTRESETTYPE_SHADER_OOB) {
    ptr = (ContextReset *)operator_new(0x60);
    ptr->m_gl = &gl;
    ptr->m_log = pTVar3;
    ptr->m_shaderType = local_1c80.m_shaderType;
    ptr->m_resourceType = local_1c80.m_resourceType;
    ptr->m_readWriteType = local_1c80.m_readWriteType;
    ptr->_vptr_ContextReset = (_func_int **)&PTR__ShadersOOB_01e033e0;
    ptr[1]._vptr_ContextReset = (_func_int **)0x0;
    local_1bd0._0_8_ = local_1bd0._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ptr[1].m_log,3,
               (value_type_conflict4 *)local_1bd0,(allocator_type *)&local_1c90);
    RVar1 = ptr->m_resourceType;
    *(bool *)&ptr[1].m_gl = RVar1 == RESOURCETYPE_UBO;
    *(bool *)((long)&ptr[1].m_gl + 2) = RVar1 == RESOURCETYPE_LOCAL_ARRAY;
    *(bool *)((long)&ptr[1].m_gl + 1) = ptr->m_readWriteType == READWRITETYPE_READ;
  }
  else {
    if (local_1c80.m_contextResetType != CONTEXTRESETTYPE_INFINITE_LOOP) {
      de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::SharedPtr
                (&contextReset,(ContextReset *)0x0);
      goto LAB_00de369a;
    }
    ptr = (ContextReset *)operator_new(0x48);
    ptr->m_gl = &gl;
    ptr->m_log = pTVar3;
    ptr->m_shaderType = local_1c80.m_shaderType;
    ptr->_vptr_ContextReset = (_func_int **)&PTR__InfiniteLoop_01e032f0;
    ptr[1]._vptr_ContextReset = (_func_int **)0x0;
    *(undefined4 *)&ptr[1].m_gl = 0;
  }
  de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::SharedPtr(&contextReset,ptr);
LAB_00de369a:
  RobustnessTestCase::Params::~Params(&local_1c80);
  isContextRobust = '\0';
  (*gl.getBooleanv)(0x90f3,&isContextRobust);
  GVar4 = (*gl.getError)();
  glu::checkError(GVar4,"getBooleanv(GL_CONTEXT_ROBUST_ACCESS_EXT, &isContextRobust)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x654);
  (*(this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,&contextReset);
  CVar2 = (this->super_RobustnessTestCase).m_params.m_contextResetType;
  if (CVar2 - CONTEXTRESETTYPE_SHADER_OOB < 2) {
    (*(this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
      [6])(this);
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Context was NOT lost. Test skipped");
  }
  else if (CVar2 == CONTEXTRESETTYPE_INFINITE_LOOP) {
    (*(this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
      [6])(this,&contextReset);
    GVar4 = (*gl.getGraphicsResetStatus)();
    if (GVar4 == 0) {
      description = "Context was NOT lost";
    }
    else {
      local_1bd0._0_8_ =
           ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      this_00 = (ostringstream *)(local_1bd0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"glGetGraphicsResetStatus() returned ");
      local_1c90.m_getName = glu::getGraphicsResetStatusName;
      local_1c90.m_value = GVar4;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c90,(ostream *)this_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      description = "Context was lost";
    }
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,(uint)(GVar4 == 0),description);
  }
  de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::~SharedPtr(&contextReset);
  RenderingContext::~RenderingContext(&context);
  return STOP;
}

Assistant:

TestCase::IterateResult ContextResetCase::iterate (void)
{
	glw::Functions	gl;

	const EGLint attribList[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 3,
		EGL_CONTEXT_MINOR_VERSION_KHR, 1,
		EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, (m_params.getRobustAccessType() == ROBUSTACCESS_TRUE) ? EGL_TRUE : EGL_FALSE,
		EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
		EGL_NONE
	};

	checkRequiredEGLExtensions(attribList);

	RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
	context.makeCurrent(m_eglSurface);

	context.initGLFunctions(&gl);
	checkRequiredGLRobustnessExtension(attribList, gl);

	execute(gl);

	return STOP;
}